

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflatePrime(zng_stream *strm,int32_t bits,int32_t value)

{
  internal_state *piVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  zng_stream *in_RDI;
  int32_t put;
  uint64_t value64;
  deflate_state *s;
  int local_30;
  ulong local_28;
  int local_14;
  int32_t local_4;
  
  local_28 = (ulong)in_EDX;
  iVar2 = deflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    if (((in_ESI < 0) || (0x40 < in_ESI)) ||
       (local_14 = in_ESI, piVar1->d_buf < piVar1->pending_out + 8)) {
      local_4 = -5;
    }
    else {
      do {
        local_30 = 0x40 - piVar1->bi_valid;
        if (local_14 < local_30) {
          local_30 = local_14;
        }
        if (piVar1->bi_valid == 0) {
          piVar1->bi_buf = local_28;
        }
        else {
          piVar1->bi_buf =
               (local_28 & (1L << ((byte)local_30 & 0x3f)) - 1U) << ((byte)piVar1->bi_valid & 0x3f)
               | piVar1->bi_buf;
        }
        piVar1->bi_valid = local_30 + piVar1->bi_valid;
        zng_tr_flush_bits((deflate_state *)0x107577);
        local_28 = local_28 >> ((byte)local_30 & 0x3f);
        local_14 = local_14 - local_30;
      } while (local_14 != 0);
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflatePrime)(PREFIX3(stream) *strm, int32_t bits, int32_t value) {
    deflate_state *s;
    uint64_t value64 = (uint64_t)value;
    int32_t put;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

#ifdef LIT_MEM
    if (bits < 0 || bits > BIT_BUF_SIZE ||
        (unsigned char *)s->d_buf < s->pending_out + ((BIT_BUF_SIZE + 7) >> 3))
        return Z_BUF_ERROR;
#else
    if (bits < 0 || bits > BIT_BUF_SIZE || bits > (int32_t)(sizeof(value) << 3) ||
        s->sym_buf < s->pending_out + ((BIT_BUF_SIZE + 7) >> 3))
        return Z_BUF_ERROR;
#endif

    do {
        put = BIT_BUF_SIZE - s->bi_valid;
        put = MIN(put, bits);

        if (s->bi_valid == 0)
            s->bi_buf = value64;
        else
            s->bi_buf |= (value64 & ((UINT64_C(1) << put) - 1)) << s->bi_valid;
        s->bi_valid += put;
        zng_tr_flush_bits(s);
        value64 >>= put;
        bits -= put;
    } while (bits);
    return Z_OK;
}